

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

Type __thiscall wasm::WasmBinaryBuilder::getType(WasmBinaryBuilder *this,int initial)

{
  bool bVar1;
  Signature SVar2;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  uintptr_t local_48;
  uintptr_t local_40;
  Type local_38;
  Type type;
  Type local_28;
  int initial_local;
  WasmBinaryBuilder *this_local;
  
  if (initial < 0) {
    wasm::Type::Type(&local_38);
    bVar1 = getBasicType(this,initial,&local_38);
    if (bVar1) {
      this_local = (WasmBinaryBuilder *)local_38.id;
    }
    else if (initial == -0x40) {
      wasm::Type::Type((Type *)&this_local,none);
    }
    else if (initial == -0x15) {
      local_48 = (uintptr_t)getHeapType(this);
      wasm::Type::Type((Type *)&this_local,(HeapType)local_48,NonNullable);
    }
    else {
      if (initial != -0x14) {
        std::__cxx11::to_string(&local_88,initial);
        std::operator+(&local_68,"invalid wasm type: ",&local_88);
        throwError(this,&local_68);
      }
      local_40 = (uintptr_t)getHeapType(this);
      wasm::Type::Type((Type *)&this_local,(HeapType)local_40,Nullable);
    }
  }
  else {
    SVar2 = getSignatureByTypeIndex(this,initial);
    local_28 = SVar2.results.id;
    this_local = (WasmBinaryBuilder *)local_28.id;
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type WasmBinaryBuilder::getType(int initial) {
  // Single value types are negative; signature indices are non-negative
  if (initial >= 0) {
    // TODO: Handle block input types properly.
    return getSignatureByTypeIndex(initial).results;
  }
  Type type;
  if (getBasicType(initial, type)) {
    return type;
  }
  switch (initial) {
    // None only used for block signatures. TODO: Separate out?
    case BinaryConsts::EncodedType::Empty:
      return Type::none;
    case BinaryConsts::EncodedType::nullable:
      return Type(getHeapType(), Nullable);
    case BinaryConsts::EncodedType::nonnullable:
      return Type(getHeapType(), NonNullable);
    default:
      throwError("invalid wasm type: " + std::to_string(initial));
  }
  WASM_UNREACHABLE("unexpected type");
}